

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_find_best_sub_pixel_tree_pruned
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV_COST_PARAMS *mv_cost_params;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  byte bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  MV MVar5;
  int *piVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  scale_factors *psVar14;
  short sVar15;
  short sVar16;
  int iVar17;
  MV *pMVar18;
  SubpelMvLimits *mv_limits;
  long lVar19;
  short sVar20;
  short sVar21;
  uint is_scaled;
  uint besterr;
  MV left_mv;
  int dummy;
  MV right_mv;
  MV top_mv;
  MV bottom_right_mv;
  MV bottom_mv;
  int dummy_2;
  MV top_right_mv;
  MV top_left_mv;
  
  iVar13 = ms_params->allow_hp;
  bVar1 = ms_params->forced_stop;
  iVar4 = ms_params->iters_per_step;
  piVar6 = ms_params->cost_list;
  besterr = 0x7fffffff;
  sVar20 = start_mv.row;
  bestmv->row = sVar20;
  sVar15 = start_mv.col;
  bestmv->col = sVar15;
  if (((*xd->mi)->field_0xa7 & 0x80) == 0) {
    psVar14 = xd->block_ref_scale_factors[0];
  }
  else {
    psVar14 = &cm->sf_identity;
  }
  is_scaled = 0;
  if (((psVar14->x_scale_fp != -1) && (psVar14->y_scale_fp != -1)) &&
     (is_scaled = 1, psVar14->x_scale_fp == 0x4000)) {
    is_scaled = (uint)(psVar14->y_scale_fp != 0x4000);
  }
  mv_cost_params = &ms_params->mv_cost_params;
  var_params = &ms_params->var_params;
  if ((start_mv_stats == (FULLPEL_MV_STATS *)0x0) || (is_scaled != 0)) {
    if (is_scaled == 0) {
      besterr = setup_center_error(xd,bestmv,var_params,mv_cost_params,sse1,distortion);
    }
    else {
      besterr = upsampled_setup_center_error(xd,cm,bestmv,var_params,mv_cost_params,sse1,distortion)
      ;
    }
  }
  else {
    besterr = start_mv_stats->err_cost + start_mv_stats->distortion;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  }
  if (bVar1 == 3) {
    return besterr;
  }
  if (last_mv_search_list != (int_mv *)0x0) {
    MVar5 = *bestmv;
    if ((MVar5.row == (last_mv_search_list->as_mv).row) &&
       ((int)MVar5 >> 0x10 == (int)(last_mv_search_list->as_mv).col)) {
      return 0x7fffffff;
    }
    (last_mv_search_list->as_mv).row = MVar5.row;
    (last_mv_search_list->as_mv).col = MVar5.col;
  }
  mv_limits = &ms_params->mv_limits;
  top_mv.col = sVar15;
  if (((((piVar6 != (int *)0x0) && (*piVar6 != 0x7fffffff)) && (piVar6[1] != 0x7fffffff)) &&
      ((piVar6[2] != 0x7fffffff && (piVar6[3] != 0x7fffffff)))) && (piVar6[4] != 0x7fffffff)) {
    bottom_mv.col = sVar15 + -4;
    left_mv.col = bottom_mv.col;
    left_mv.row = sVar20;
    bottom_right_mv.col = sVar15 + 4;
    dummy = CONCAT22(bottom_right_mv.col,sVar20);
    right_mv.row = sVar20 + 4;
    top_mv.row = sVar20 + -4;
    right_mv.col = sVar15;
    bottom_right_mv.row = right_mv.row;
    bottom_mv.row = right_mv.row;
    iVar13 = (*(code *)(&DAT_004e2f3c +
                       *(int *)(&DAT_004e2f3c +
                               (ulong)((uint)(piVar6[3] <= piVar6[1]) +
                                      (uint)(piVar6[4] <= piVar6[2]) * 2) * 4)))();
    return iVar13;
  }
  iVar8 = (int)start_mv >> 0x10;
  left_mv.col = sVar15 + -4;
  left_mv.row = sVar20;
  dummy = 0;
  uVar9 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                            distortion,&dummy,is_scaled);
  right_mv.col = sVar15 + 4;
  right_mv.row = sVar20;
  uVar10 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                             sse1,distortion,&dummy,is_scaled);
  top_mv.row = sVar20 + -4;
  uVar11 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                             distortion,&dummy,is_scaled);
  bottom_mv.row = sVar20 + 4;
  bottom_mv.col = sVar15;
  uVar12 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                             sse1,distortion,&dummy,is_scaled);
  sVar7 = -4;
  if (uVar12 < uVar11) {
    sVar7 = 4;
  }
  sVar21 = -4;
  if (uVar10 < uVar9) {
    sVar21 = 4;
  }
  bottom_right_mv.row = sVar7 + sVar20;
  bottom_right_mv.col = sVar21 + sVar15;
  check_better_fast(xd,cm,&bottom_right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                    distortion,&dummy,is_scaled);
  if (1 < iVar4) {
    sVar15 = bestmv->row;
    sVar16 = bestmv->col;
    iVar17 = (int)sVar16;
    left_mv.row = 0;
    left_mv.col = 0;
    if (iVar8 == iVar17 || sVar20 == sVar15) {
      if (sVar20 == sVar15 && iVar8 != iVar17) {
        right_mv.col = sVar16 + sVar21;
        dummy = CONCAT22(right_mv.col,sVar15 + 4);
        right_mv.row = sVar15 + -4;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        top_mv.row = sVar15 - sVar7;
        pMVar18 = &top_mv;
        top_mv.col = sVar16;
      }
      else {
        if (sVar20 == sVar15 || iVar8 != iVar17) goto LAB_001d8482;
        right_mv.row = sVar7 + sVar15;
        dummy = CONCAT22(sVar16 + 4,right_mv.row);
        right_mv.col = sVar16 + -4;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        pMVar18 = &top_mv;
        top_mv.row = sVar15;
        top_mv.col = sVar16 - sVar21;
      }
    }
    else {
      dummy = CONCAT22(sVar16 + sVar21,sVar15);
      right_mv.row = sVar15 + sVar7;
      right_mv.col = sVar16;
      check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
      pMVar18 = &right_mv;
    }
    check_better_fast(xd,cm,pMVar18,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                      distortion,(int *)&left_mv,is_scaled);
  }
LAB_001d8482:
  if (1 < bVar1) {
    sVar15 = 2;
    lVar19 = 1;
    goto LAB_001d8aae;
  }
  if (last_mv_search_list != (int_mv *)0x0) {
    MVar5 = *bestmv;
    if ((MVar5.row == last_mv_search_list[1].as_mv.row) &&
       ((int)MVar5 >> 0x10 == (int)*(short *)((long)last_mv_search_list + 6))) {
      return 0x7fffffff;
    }
    last_mv_search_list[1].as_mv.row = MVar5.row;
    *(int16_t *)((long)last_mv_search_list + 6) = MVar5.col;
  }
  sVar20 = bestmv->row;
  sVar7 = bestmv->col;
  left_mv.col = sVar7 + -2;
  left_mv.row = sVar20;
  dummy = 0;
  uVar9 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                            distortion,&dummy,is_scaled);
  right_mv.col = sVar7 + 2;
  right_mv.row = sVar20;
  uVar10 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                             sse1,distortion,&dummy,is_scaled);
  top_mv.row = sVar20 + -2;
  top_mv.col = sVar7;
  uVar11 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                             distortion,&dummy,is_scaled);
  bottom_mv.row = sVar20 + 2;
  bottom_mv.col = sVar7;
  uVar12 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                             sse1,distortion,&dummy,is_scaled);
  sVar21 = -2;
  if (uVar12 < uVar11) {
    sVar21 = 2;
  }
  sVar16 = -2;
  if (uVar10 < uVar9) {
    sVar16 = 2;
  }
  bottom_right_mv.row = sVar20 + sVar21;
  bottom_right_mv.col = sVar7 + sVar16;
  check_better_fast(xd,cm,&bottom_right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                    distortion,&dummy,is_scaled);
  sVar15 = 1;
  if (1 < iVar4) {
    sVar2 = bestmv->row;
    sVar3 = bestmv->col;
    left_mv.row = 0;
    left_mv.col = 0;
    if (sVar7 == sVar3 || sVar20 == sVar2) {
      if (sVar20 == sVar2 && sVar7 != sVar3) {
        right_mv.col = sVar3 + sVar16;
        dummy = CONCAT22(right_mv.col,sVar2 + 2);
        right_mv.row = sVar2 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        top_mv.row = sVar2 - sVar21;
        top_mv.col = sVar3;
      }
      else {
        if (sVar20 == sVar2 || sVar7 != sVar3) goto LAB_001d8aa1;
        right_mv.row = sVar21 + sVar2;
        dummy = CONCAT22(sVar3 + 2,right_mv.row);
        right_mv.col = sVar3 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                          distortion,(int *)&left_mv,is_scaled);
        top_mv.row = sVar2;
        top_mv.col = sVar3 - sVar16;
      }
      check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
    }
    else {
      dummy = CONCAT22(sVar3 + sVar16,sVar2);
      right_mv.row = sVar2 + sVar21;
      right_mv.col = sVar3;
      check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
      check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
    }
  }
LAB_001d8aa1:
  lVar19 = 2;
LAB_001d8aae:
  if (bVar1 == 0 && iVar13 != 0) {
    if (last_mv_search_list != (int_mv *)0x0) {
      MVar5 = *bestmv;
      if ((MVar5.row == last_mv_search_list[lVar19].as_mv.row) &&
         ((int)MVar5 >> 0x10 == (int)*(short *)((long)last_mv_search_list + lVar19 * 4 + 2))) {
        return 0x7fffffff;
      }
      last_mv_search_list[lVar19].as_mv.row = MVar5.row;
      *(int16_t *)((long)last_mv_search_list + lVar19 * 4 + 2) = MVar5.col;
    }
    sVar20 = bestmv->row;
    sVar7 = bestmv->col;
    left_mv.col = sVar7 - sVar15;
    left_mv.row = sVar20;
    dummy = 0;
    uVar9 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                              sse1,distortion,&dummy,is_scaled);
    right_mv.col = sVar7 + sVar15;
    right_mv.row = sVar20;
    uVar10 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                               sse1,distortion,&dummy,is_scaled);
    top_mv.row = sVar20 - sVar15;
    top_mv.col = sVar7;
    uVar11 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                               sse1,distortion,&dummy,is_scaled);
    bottom_mv.row = sVar20 + sVar15;
    bottom_mv.col = sVar7;
    uVar12 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                               sse1,distortion,&dummy,is_scaled);
    sVar21 = -sVar15;
    if (uVar12 < uVar11) {
      sVar21 = sVar15;
    }
    sVar16 = -sVar15;
    if (uVar10 < uVar9) {
      sVar16 = sVar15;
    }
    bottom_right_mv.row = sVar20 + sVar21;
    bottom_right_mv.col = sVar7 + sVar16;
    check_better_fast(xd,cm,&bottom_right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                      sse1,distortion,&dummy,is_scaled);
    if (1 < iVar4) {
      sVar2 = bestmv->row;
      sVar3 = bestmv->col;
      left_mv.row = 0;
      left_mv.col = 0;
      if (sVar7 == sVar3 || sVar20 == sVar2) {
        if (sVar20 == sVar2 && sVar7 != sVar3) {
          right_mv.col = sVar3 + sVar16;
          dummy = CONCAT22(right_mv.col,sVar15 + sVar2);
          right_mv.row = sVar2 - sVar15;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                            sse1,distortion,(int *)&left_mv,is_scaled);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1
                            ,distortion,(int *)&left_mv,is_scaled);
          top_mv.row = sVar2 - sVar21;
          top_mv.col = sVar3;
        }
        else {
          if (sVar20 == sVar2 || sVar7 != sVar3) {
            return besterr;
          }
          right_mv.row = sVar21 + sVar2;
          dummy = CONCAT22(sVar3 + sVar15,right_mv.row);
          right_mv.col = sVar3 - sVar15;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                            sse1,distortion,(int *)&left_mv,is_scaled);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1
                            ,distortion,(int *)&left_mv,is_scaled);
          top_mv.row = sVar2;
          top_mv.col = sVar3 - sVar16;
        }
        pMVar18 = &top_mv;
      }
      else {
        dummy = CONCAT22(sVar3 + sVar16,sVar2);
        right_mv.row = sVar2 + sVar21;
        right_mv.col = sVar3;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&besterr,
                          sse1,distortion,(int *)&left_mv,is_scaled);
        pMVar18 = &right_mv;
      }
      check_better_fast(xd,cm,pMVar18,bestmv,mv_limits,var_params,mv_cost_params,&besterr,sse1,
                        distortion,(int *)&left_mv,is_scaled);
    }
  }
  return besterr;
}

Assistant:

int av1_find_best_sub_pixel_tree_pruned(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)cm;
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const int *cost_list = ms_params->cost_list;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;

  // The iteration we are current searching for. Iter 0 corresponds to fullpel
  // mv, iter 1 to half pel, and so on
  int iter = 0;
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel
  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    besterr =
        setup_center_error_facade(xd, cm, bestmv, var_params, mv_cost_params,
                                  sse1, distortion, is_scaled);
  }

  // If forced_stop is FULL_PEL, return.
  if (forced_stop == FULL_PEL) return besterr;

  if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
    return INT_MAX;
  }
  iter++;

  if (cost_list && cost_list[0] != INT_MAX && cost_list[1] != INT_MAX &&
      cost_list[2] != INT_MAX && cost_list[3] != INT_MAX &&
      cost_list[4] != INT_MAX) {
    const unsigned int whichdir = (cost_list[1] < cost_list[3] ? 0 : 1) +
                                  (cost_list[2] < cost_list[4] ? 0 : 2);

    const MV left_mv = { start_mv.row, start_mv.col - hstep };
    const MV right_mv = { start_mv.row, start_mv.col + hstep };
    const MV bottom_mv = { start_mv.row + hstep, start_mv.col };
    const MV top_mv = { start_mv.row - hstep, start_mv.col };

    const MV bottom_left_mv = { start_mv.row + hstep, start_mv.col - hstep };
    const MV bottom_right_mv = { start_mv.row + hstep, start_mv.col + hstep };
    const MV top_left_mv = { start_mv.row - hstep, start_mv.col - hstep };
    const MV top_right_mv = { start_mv.row - hstep, start_mv.col + hstep };

    int dummy = 0;

    switch (whichdir) {
      case 0:  // bottom left quadrant
        check_better_fast(xd, cm, &left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_left_mv, bestmv, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, &dummy, is_scaled);
        break;
      case 1:  // bottom right quadrant
        check_better_fast(xd, cm, &right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_right_mv, bestmv, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, &dummy, is_scaled);
        break;
      case 2:  // top left quadrant
        check_better_fast(xd, cm, &left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        break;
      case 3:  // top right quadrant
        check_better_fast(xd, cm, &right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        break;
    }
  } else {
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  // Each subsequent iteration checks at least one point in common with
  // the last iteration could be 2 ( if diag selected) 1/4 pel
  if (forced_stop < HALF_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  if (allow_hp && forced_stop == EIGHTH_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  return besterr;
}